

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlFAComputesDeterminism(xmlRegParserCtxtPtr ctxt)

{
  int *piVar1;
  xmlRegTrans *pxVar2;
  xmlRegAtomType xVar3;
  xmlRegAtomType xVar4;
  xmlRegAtomType xVar5;
  xmlRegStatePtr pxVar6;
  xmlRegTrans *pxVar7;
  xmlRegAtomPtr pxVar8;
  xmlRegAtomPtr pxVar9;
  xmlChar *str;
  xmlChar *str_00;
  xmlRegRangePtr pxVar10;
  xmlRegRangePtr pxVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  xmlChar *pxVar16;
  xmlChar *pxVar17;
  byte bVar18;
  byte bVar19;
  long lVar20;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *piVar21;
  long lVar22;
  int iVar23;
  xmlRegRangePtr pxVar24;
  xmlRegAtomType xVar25;
  xmlRegTrans *pxVar26;
  long lVar27;
  int *piVar28;
  long lVar29;
  long lVar30;
  xmlRegAtomPtr pxVar31;
  bool bVar32;
  
  iVar23 = ctxt->determinist;
  if (iVar23 == -1) {
    iVar14 = ctxt->nbStates;
    iVar23 = 1;
    if (0 < iVar14) {
      uVar13 = ctxt->flags;
      lVar20 = 0;
      do {
        pxVar6 = ctxt->states[lVar20];
        if ((pxVar6 != (xmlRegStatePtr)0x0) && (iVar23 = pxVar6->nbTrans, 1 < iVar23)) {
          lVar27 = 0;
          lVar29 = 0;
          do {
            if ((pxVar6->trans[lVar29].atom != (xmlRegAtomPtr)0x0) &&
               (pxVar26 = pxVar6->trans + lVar29, lVar29 != 0 && pxVar26->to != -1)) {
              lVar22 = 0;
              do {
                pxVar7 = pxVar6->trans;
                iVar23 = *(int *)((long)&pxVar7->to + lVar22);
                if (((iVar23 != -1) &&
                    (pxVar8 = *(xmlRegAtomPtr *)((long)&pxVar7->atom + lVar22),
                    pxVar8 != (xmlRegAtomPtr)0x0)) && (pxVar26->to == iVar23)) {
                  pxVar9 = pxVar26->atom;
                  if (pxVar9 == pxVar8) {
LAB_001a81c8:
                    if ((pxVar26->counter == *(int *)((long)&pxVar7->counter + lVar22)) &&
                       (pxVar26->count == *(int *)((long)&pxVar7->count + lVar22))) {
                      *(undefined4 *)((long)&pxVar7->to + lVar22) = 0xffffffff;
                    }
                  }
                  else if ((pxVar9 != (xmlRegAtomPtr)0x0) &&
                          (xVar3 = pxVar9->type, xVar3 == pxVar8->type)) {
                    if (xVar3 == XML_REGEXP_CHARVAL) {
                      bVar32 = pxVar9->codepoint == pxVar8->codepoint;
LAB_001a81c1:
                      uVar12 = (uint)bVar32;
                    }
                    else {
                      if (xVar3 != XML_REGEXP_STRING) goto LAB_001a81e5;
                      if ((uVar13 & 1) != 0) {
                        bVar32 = pxVar9->valuep == pxVar8->valuep;
                        goto LAB_001a81c1;
                      }
                      uVar12 = xmlStrEqual((xmlChar *)pxVar9->valuep,(xmlChar *)pxVar8->valuep);
                    }
                    if (uVar12 != 0) goto LAB_001a81c8;
                  }
                }
LAB_001a81e5:
                lVar22 = lVar22 + 0x18;
              } while (lVar27 != lVar22);
              iVar23 = pxVar6->nbTrans;
            }
            lVar29 = lVar29 + 1;
            lVar27 = lVar27 + 0x18;
          } while (lVar29 < iVar23);
          iVar14 = ctxt->nbStates;
        }
        iVar23 = 1;
        lVar20 = lVar20 + 1;
      } while (lVar20 < iVar14);
      if (0 < iVar14) {
        lVar20 = 0;
        iVar23 = 1;
        do {
          pxVar6 = ctxt->states[lVar20];
          if ((pxVar6 != (xmlRegStatePtr)0x0) && (iVar14 = pxVar6->nbTrans, 1 < iVar14)) {
            lVar27 = 0;
            pxVar26 = (xmlRegTrans *)0x0;
            do {
              if (pxVar6->trans[lVar27].atom != (xmlRegAtomPtr)0x0) {
                pxVar7 = pxVar6->trans + lVar27;
                bVar32 = pxVar7->to == -1;
                piVar21 = (int *)CONCAT71((int7)((ulong)(lVar27 * 3) >> 8),lVar27 == 0 || bVar32);
                if (lVar27 != 0 && !bVar32) {
                  piVar1 = &pxVar7->nd;
                  lVar29 = 0;
                  do {
                    if (pxVar6->trans[lVar29].to == -1) goto LAB_001a8828;
                    pxVar2 = pxVar6->trans + lVar29;
                    pxVar8 = pxVar2->atom;
                    if (pxVar8 == (xmlRegAtomPtr)0x0) {
                      if ((long)pxVar7->to == -1) goto LAB_001a8828;
                      iVar14 = xmlFARecurseDeterminism
                                         (ctxt,*(xmlRegStatePtr *)
                                                (&((xmlRegAtomPtr)ctxt->states)->no +
                                                (long)pxVar7->to * 2),(int)piVar21,
                                          (xmlRegAtomPtr)ctxt->states);
                      xmlFAFinishRecurseDeterminism(ctxt,ctxt->states[pxVar7->to]);
                      iVar23 = 1;
                      piVar21 = extraout_RDX_00;
                      piVar28 = piVar1;
                      if (iVar14 != 0) goto LAB_001a8828;
                      goto LAB_001a881b;
                    }
                    pxVar9 = pxVar7->atom;
                    if (pxVar9 == pxVar8) goto LAB_001a8810;
                    if (pxVar9 == (xmlRegAtomPtr)0x0) goto LAB_001a8828;
                    if (pxVar9->type == XML_REGEXP_ANYCHAR) goto LAB_001a8810;
                    xVar3 = pxVar8->type;
                    piVar21 = (int *)(ulong)xVar3;
                    if (xVar3 == XML_REGEXP_ANYCHAR) goto LAB_001a8810;
                    pxVar31 = pxVar9;
                    if (xVar3 < pxVar9->type) {
                      pxVar31 = pxVar8;
                      pxVar8 = pxVar9;
                    }
                    xVar3 = pxVar31->type;
                    xVar4 = pxVar8->type;
                    if (((xVar3 == xVar4) ||
                        (piVar21 = (int *)(ulong)(xVar3 - XML_REGEXP_EPSILON),
                        xVar3 - XML_REGEXP_EPSILON < 6)) ||
                       (piVar21 = (int *)(ulong)(xVar4 - XML_REGEXP_EPSILON),
                       xVar4 - XML_REGEXP_EPSILON < 6)) goto switchD_001a8853_caseD_8;
                    xVar5 = xVar4;
                    if (xVar3 >= xVar4 && xVar3 != xVar4) {
                      xVar5 = xVar3;
                    }
                    piVar21 = (int *)(ulong)xVar5;
                    xVar25 = xVar4;
                    if (xVar3 < xVar4) {
                      xVar25 = xVar3;
                    }
                    switch(xVar25) {
                    case XML_REGEXP_LETTER:
                      bVar32 = xVar5 < XML_REGEXP_MARK;
                      break;
                    case XML_REGEXP_LETTER_UPPERCASE:
                    case XML_REGEXP_LETTER_LOWERCASE:
                    case XML_REGEXP_LETTER_TITLECASE:
                    case XML_REGEXP_LETTER_MODIFIER:
                    case XML_REGEXP_LETTER_OTHERS:
                    case XML_REGEXP_MARK_NONSPACING:
                    case XML_REGEXP_MARK_SPACECOMBINING:
                    case XML_REGEXP_MARK_ENCLOSING:
                    case XML_REGEXP_NUMBER_DECIMAL:
                    case XML_REGEXP_NUMBER_LETTER:
                    case XML_REGEXP_NUMBER_OTHERS:
                    case XML_REGEXP_PUNCT_CONNECTOR:
                    case XML_REGEXP_PUNCT_DASH:
                    case XML_REGEXP_PUNCT_OPEN:
                    case XML_REGEXP_PUNCT_CLOSE:
                    case XML_REGEXP_PUNCT_INITQUOTE:
                    case XML_REGEXP_PUNCT_FINQUOTE:
                    case XML_REGEXP_PUNCT_OTHERS:
                    case XML_REGEXP_SEPAR_SPACE:
                    case XML_REGEXP_SEPAR_LINE:
                    case XML_REGEXP_SEPAR_PARA:
                    case XML_REGEXP_SYMBOL_MATH:
                    case XML_REGEXP_SYMBOL_CURRENCY:
                    case XML_REGEXP_SYMBOL_MODIFIER:
                    case XML_REGEXP_SYMBOL_OTHERS:
                    case XML_REGEXP_OTHER_CONTROL:
                    case XML_REGEXP_OTHER_FORMAT:
                    case XML_REGEXP_OTHER_PRIVATE:
                    case XML_REGEXP_OTHER_NA:
                      piVar21 = piVar1;
                      goto LAB_001a8828;
                    case XML_REGEXP_MARK:
                      bVar32 = xVar5 < XML_REGEXP_NUMBER;
                      break;
                    case XML_REGEXP_NUMBER:
                      bVar32 = xVar5 < XML_REGEXP_PUNCT;
                      break;
                    case XML_REGEXP_PUNCT:
                      bVar32 = xVar5 < XML_REGEXP_SEPAR;
                      break;
                    case XML_REGEXP_SEPAR:
                      bVar32 = xVar5 < XML_REGEXP_SYMBOL;
                      break;
                    case XML_REGEXP_SYMBOL:
                      bVar32 = xVar5 < XML_REGEXP_OTHER;
                      break;
                    case XML_REGEXP_OTHER:
                      piVar21 = piVar1;
                      if (xVar5 < XML_REGEXP_BLOCK_NAME) goto switchD_001a8853_caseD_8;
                      goto LAB_001a8828;
                    default:
                      switch(xVar25) {
                      case XML_REGEXP_ANYSPACE:
                        if ((xVar5 - XML_REGEXP_LETTER < 0x16) ||
                           ((xVar5 - XML_REGEXP_SYMBOL < 5 || (xVar5 == XML_REGEXP_NOTSPACE))))
                        goto LAB_001a8828;
                        break;
                      case XML_REGEXP_INITNAME:
                        if ((xVar5 - XML_REGEXP_MARK < 0x1e) || (xVar5 == XML_REGEXP_NOTINITNAME))
                        goto LAB_001a8828;
                        break;
                      case XML_REGEXP_NAMECHAR:
                        if (((xVar5 - XML_REGEXP_PUNCT < 0x16) || (xVar5 - XML_REGEXP_MARK < 4)) ||
                           (xVar5 == XML_REGEXP_NOTNAMECHAR)) goto LAB_001a8828;
                        break;
                      case XML_REGEXP_DECIMAL:
                        if (((xVar5 - XML_REGEXP_LETTER < 0x24) &&
                            ((0xfffffc3ffU >> ((ulong)(xVar5 - XML_REGEXP_LETTER) & 0x3f) & 1) != 0)
                            ) || (piVar21 = (int *)(ulong)(xVar5 - XML_REGEXP_NOTDECIMAL),
                                 xVar5 - XML_REGEXP_NOTDECIMAL < 2)) goto LAB_001a8828;
                        break;
                      case XML_REGEXP_REALCHAR:
                        if (((xVar5 - XML_REGEXP_PUNCT < 0x16) || (xVar5 - XML_REGEXP_MARK < 4)) ||
                           (xVar5 == XML_REGEXP_NOTDECIMAL)) goto LAB_001a8828;
                      }
                      goto switchD_001a8853_caseD_8;
                    }
                    piVar21 = piVar1;
                    if (bVar32) {
switchD_001a8853_caseD_8:
                      if (xVar3 == XML_REGEXP_CHARVAL) {
                        if (xVar4 == XML_REGEXP_CHARVAL) {
                          piVar21 = (int *)(ulong)(pxVar31->codepoint == pxVar8->codepoint);
                        }
                        else {
                          uVar13 = xmlRegCheckCharacter(pxVar8,pxVar31->codepoint);
                          if ((int)uVar13 < 0) {
                            uVar13 = 1;
                          }
                          piVar21 = (int *)(ulong)uVar13;
                        }
switchD_001a8618_default:
                        uVar13 = (uint)((uint)piVar21 == 0);
                        if (pxVar31->neg == pxVar8->neg) {
                          uVar13 = (uint)piVar21;
                        }
                        if (uVar13 == 0) goto LAB_001a8828;
                      }
                      else {
                        if (xVar3 == XML_REGEXP_RANGES) {
                          piVar21 = (int *)&DAT_00000001;
                          if (xVar4 == XML_REGEXP_RANGES) {
                            iVar14 = pxVar31->nbRanges;
                            if (0 < iVar14) {
                              iVar15 = pxVar8->nbRanges;
                              lVar22 = 0;
LAB_001a8490:
                              if (0 < iVar15) {
                                lVar30 = 0;
LAB_001a84a0:
                                pxVar10 = pxVar31->ranges[lVar22];
                                xVar3 = pxVar10->type;
                                if ((xVar3 != XML_REGEXP_RANGES) &&
                                   ((xVar3 & ~XML_REGEXP_EPSILON) != XML_REGEXP_SUBREG)) {
                                  pxVar11 = pxVar8->ranges[lVar30];
                                  if (pxVar11->type - XML_REGEXP_RANGES < 3) goto LAB_001a84b0;
                                  pxVar24 = pxVar11;
                                  if (pxVar11->type < xVar3) {
                                    pxVar24 = pxVar10;
                                    pxVar10 = pxVar11;
                                  }
                                  xVar3 = pxVar10->type;
                                  bVar32 = true;
                                  if ((xVar3 == XML_REGEXP_ANYCHAR) ||
                                     (xVar4 = pxVar24->type, xVar4 == XML_REGEXP_ANYCHAR))
                                  goto LAB_001a851e;
                                  if ((xVar3 == XML_REGEXP_EPSILON) || (xVar4 == XML_REGEXP_EPSILON)
                                     ) goto LAB_001a84b0;
                                  if (xVar3 == xVar4) {
                                    bVar32 = true;
                                    if (xVar3 == XML_REGEXP_CHARVAL) {
                                      if (pxVar10->end < pxVar24->start) {
LAB_001a8573:
                                        bVar32 = false;
                                      }
                                      else {
                                        bVar32 = pxVar10->start <= pxVar24->end;
                                      }
                                    }
                                  }
                                  else {
                                    piVar21 = (int *)&DAT_00000001;
                                    if (xVar3 == XML_REGEXP_CHARVAL) {
                                      if (pxVar10->neg == 0) {
                                        if (pxVar24->neg == 0) goto LAB_001a85e0;
LAB_001a862c:
                                        bVar19 = 1;
                                        bVar18 = 0;
                                      }
                                      else {
                                        if (pxVar24->neg == 0) goto LAB_001a862c;
LAB_001a85e0:
                                        bVar18 = 1;
                                        bVar19 = 0;
                                      }
                                      iVar14 = pxVar10->start;
                                      if (pxVar10->start <= pxVar10->end) {
                                        do {
                                          iVar15 = xmlRegCheckCharacterRange
                                                             (pxVar24->type,iVar14,pxVar24->start,
                                                              pxVar24->end,(int)pxVar24->blockName,
                                                              (xmlChar *)pxVar6);
                                          if (iVar15 < 0) break;
                                          if (((bool)(bVar19 & iVar15 == 0)) ||
                                             ((bool)(iVar15 == 1 & bVar18)))
                                          goto switchD_001a8618_caseD_8;
                                          bVar32 = iVar14 < pxVar10->end;
                                          iVar14 = iVar14 + 1;
                                        } while (bVar32);
                                        iVar15 = pxVar8->nbRanges;
                                      }
                                      goto LAB_001a84b0;
                                    }
                                    if ((xVar3 == XML_REGEXP_BLOCK_NAME) ||
                                       (xVar4 == XML_REGEXP_BLOCK_NAME))
                                    goto switchD_001a8618_default;
                                    if ((xVar3 < XML_REGEXP_LETTER) || (xVar4 < XML_REGEXP_LETTER))
                                    {
                                      switch(xVar3) {
                                      case XML_REGEXP_ANYSPACE:
                                        if (xVar4 == XML_REGEXP_NOTSPACE) {
LAB_001a871c:
                                          bVar32 = false;
                                          goto LAB_001a851e;
                                        }
                                      case XML_REGEXP_NOTSPACE:
                                      case XML_REGEXP_NOTINITNAME:
                                      case XML_REGEXP_NOTNAMECHAR:
                                      case XML_REGEXP_NOTDECIMAL:
                                        break;
                                      case XML_REGEXP_INITNAME:
                                        if (xVar4 == XML_REGEXP_NOTINITNAME) goto LAB_001a871c;
                                        break;
                                      case XML_REGEXP_NAMECHAR:
                                        if (xVar4 == XML_REGEXP_NOTNAMECHAR) goto LAB_001a871c;
                                        break;
                                      case XML_REGEXP_DECIMAL:
                                        if (xVar4 == XML_REGEXP_NOTDECIMAL) goto LAB_001a871c;
                                        break;
                                      case XML_REGEXP_REALCHAR:
                                        if (xVar4 == XML_REGEXP_NOTREALCHAR) goto LAB_001a871c;
                                        break;
                                      default:
                                        goto switchD_001a8618_default;
                                      }
                                      goto switchD_001a8618_caseD_8;
                                    }
                                    if ((int)xVar3 < 0x72) {
                                      if (xVar3 == XML_REGEXP_LETTER) {
                                        bVar32 = xVar4 - XML_REGEXP_LETTER_UPPERCASE < 5;
                                      }
                                      else {
                                        if (xVar3 == XML_REGEXP_MARK) {
                                          uVar13 = xVar4 - XML_REGEXP_MARK_NONSPACING;
                                        }
                                        else {
                                          if (xVar3 != XML_REGEXP_NUMBER) goto LAB_001a872b;
                                          uVar13 = xVar4 - XML_REGEXP_NUMBER_DECIMAL;
                                        }
LAB_001a8754:
                                        bVar32 = uVar13 < 3;
                                      }
                                    }
                                    else {
                                      if ((int)xVar3 < 0x7e) {
                                        if (xVar3 == XML_REGEXP_PUNCT) {
                                          bVar32 = xVar4 - XML_REGEXP_PUNCT_CONNECTOR < 7;
                                          goto LAB_001a851e;
                                        }
                                        if (xVar3 == XML_REGEXP_SEPAR) {
                                          uVar13 = xVar4 - XML_REGEXP_SEPAR_SPACE;
                                          goto LAB_001a8754;
                                        }
LAB_001a872b:
                                        if (xVar4 < XML_REGEXP_BLOCK_NAME) goto LAB_001a8573;
                                        goto switchD_001a8618_default;
                                      }
                                      if (xVar3 != XML_REGEXP_SYMBOL) {
                                        if (xVar3 == XML_REGEXP_OTHER) {
                                          uVar13 = xVar4 - XML_REGEXP_OTHER_CONTROL;
                                          goto LAB_001a8754;
                                        }
                                        goto LAB_001a872b;
                                      }
                                      bVar32 = xVar4 - XML_REGEXP_SYMBOL_MATH < 4;
                                    }
                                  }
LAB_001a851e:
                                  if ((pxVar10->neg == 0) == (pxVar24->neg == 0)) {
                                    if (bVar32) goto switchD_001a8618_caseD_8;
                                  }
                                  else if (!bVar32) {
switchD_001a8618_caseD_8:
                                    piVar21 = (int *)&DAT_00000001;
                                    goto switchD_001a8618_default;
                                  }
                                }
LAB_001a84b0:
                                lVar30 = lVar30 + 1;
                                if (iVar15 <= lVar30) goto LAB_001a875f;
                                goto LAB_001a84a0;
                              }
                              goto LAB_001a876c;
                            }
LAB_001a877b:
                            piVar21 = (int *)0x0;
                          }
                          goto switchD_001a8618_default;
                        }
                        if (xVar3 == XML_REGEXP_STRING) {
                          str = (xmlChar *)pxVar31->valuep;
                          str_00 = (xmlChar *)pxVar8->valuep;
                          pxVar16 = xmlStrchr(str,'|');
                          pxVar17 = xmlStrchr(str_00,'|');
                          piVar21 = extraout_RDX;
                          if ((pxVar16 != (xmlChar *)0x0) == (pxVar17 == (xmlChar *)0x0))
                          goto LAB_001a8828;
                          uVar13 = xmlRegStrEqualWildcard(str,str_00);
                          piVar21 = (int *)(ulong)uVar13;
                          goto switchD_001a8618_default;
                        }
                      }
LAB_001a8810:
                      *piVar1 = 1;
                      piVar28 = &pxVar2->nd;
LAB_001a881b:
                      *piVar28 = 1;
                      iVar23 = 0;
                      pxVar26 = pxVar7;
                    }
LAB_001a8828:
                    lVar29 = lVar29 + 1;
                  } while (lVar29 != lVar27);
                  iVar14 = pxVar6->nbTrans;
                }
              }
              lVar27 = lVar27 + 1;
            } while (lVar27 < iVar14);
            if (pxVar26 != (xmlRegTrans *)0x0) {
              pxVar26->nd = 2;
            }
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < ctxt->nbStates);
      }
    }
    ctxt->determinist = iVar23;
  }
  return iVar23;
LAB_001a875f:
  iVar14 = pxVar31->nbRanges;
LAB_001a876c:
  lVar22 = lVar22 + 1;
  if (iVar14 <= lVar22) goto LAB_001a877b;
  goto LAB_001a8490;
}

Assistant:

static int
xmlFAComputesDeterminism(xmlRegParserCtxtPtr ctxt) {
    int statenr, transnr;
    xmlRegStatePtr state;
    xmlRegTransPtr t1, t2, last;
    int i;
    int ret = 1;
    int deep = 1;

#ifdef DEBUG_REGEXP_GRAPH
    printf("xmlFAComputesDeterminism\n");
    xmlRegPrintCtxt(stdout, ctxt);
#endif
    if (ctxt->determinist != -1)
	return(ctxt->determinist);

    if (ctxt->flags & AM_AUTOMATA_RNG)
        deep = 0;

    /*
     * First cleanup the automata removing cancelled transitions
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if (state->nbTrans < 2)
	    continue;
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    t1 = &(state->trans[transnr]);
	    /*
	     * Determinism checks in case of counted or all transitions
	     * will have to be handled separately
	     */
	    if (t1->atom == NULL) {
		/* t1->nd = 1; */
		continue;
	    }
	    if (t1->to == -1) /* eliminated */
		continue;
	    for (i = 0;i < transnr;i++) {
		t2 = &(state->trans[i]);
		if (t2->to == -1) /* eliminated */
		    continue;
		if (t2->atom != NULL) {
		    if (t1->to == t2->to) {
                        /*
                         * Here we use deep because we want to keep the
                         * transitions which indicate a conflict
                         */
			if (xmlFAEqualAtoms(t1->atom, t2->atom, deep) &&
                            (t1->counter == t2->counter) &&
                            (t1->count == t2->count))
			    t2->to = -1; /* eliminated */
		    }
		}
	    }
	}
    }

    /*
     * Check for all states that there aren't 2 transitions
     * with the same atom and a different target.
     */
    for (statenr = 0;statenr < ctxt->nbStates;statenr++) {
	state = ctxt->states[statenr];
	if (state == NULL)
	    continue;
	if (state->nbTrans < 2)
	    continue;
	last = NULL;
	for (transnr = 0;transnr < state->nbTrans;transnr++) {
	    t1 = &(state->trans[transnr]);
	    /*
	     * Determinism checks in case of counted or all transitions
	     * will have to be handled separately
	     */
	    if (t1->atom == NULL) {
		continue;
	    }
	    if (t1->to == -1) /* eliminated */
		continue;
	    for (i = 0;i < transnr;i++) {
		t2 = &(state->trans[i]);
		if (t2->to == -1) /* eliminated */
		    continue;
		if (t2->atom != NULL) {
                    /*
                     * But here we don't use deep because we want to
                     * find transitions which indicate a conflict
                     */
		    if (xmlFACompareAtoms(t1->atom, t2->atom, 1)) {
			ret = 0;
			/* mark the transitions as non-deterministic ones */
			t1->nd = 1;
			t2->nd = 1;
			last = t1;
		    }
		} else if (t1->to != -1) {
		    /*
		     * do the closure in case of remaining specific
		     * epsilon transitions like choices or all
		     */
		    ret = xmlFARecurseDeterminism(ctxt, ctxt->states[t1->to],
						   t2->to, t2->atom);
                    xmlFAFinishRecurseDeterminism(ctxt, ctxt->states[t1->to]);
		    /* don't shortcut the computation so all non deterministic
		       transition get marked down
		    if (ret == 0)
			return(0);
		     */
		    if (ret == 0) {
			t1->nd = 1;
			/* t2->nd = 1; */
			last = t1;
		    }
		}
	    }
	    /* don't shortcut the computation so all non deterministic
	       transition get marked down
	    if (ret == 0)
		break; */
	}

	/*
	 * mark specifically the last non-deterministic transition
	 * from a state since there is no need to set-up rollback
	 * from it
	 */
	if (last != NULL) {
	    last->nd = 2;
	}

	/* don't shortcut the computation so all non deterministic
	   transition get marked down
	if (ret == 0)
	    break; */
    }

    ctxt->determinist = ret;
    return(ret);
}